

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O0

c_v64 c_v64_load_unaligned(void *p)

{
  int c;
  uint8_t *q;
  uint8_t *pp;
  void *p_local;
  c_v64 t;
  
  for (c = 0; c < 8; c = c + 1) {
    t.u8[c] = *(uint8_t *)((long)p + (long)c);
  }
  return (c_v64)t.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_load_unaligned(const void *p) {
  c_v64 t;
  uint8_t *pp = (uint8_t *)p;
  uint8_t *q = (uint8_t *)&t;
  int c;
  for (c = 0; c < 8; c++) q[c] = pp[c];
  return t;
}